

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
* google::protobuf::compiler::cpp::anon_unknown_20::Sorted<google::protobuf::FileDescriptor>
            (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *__return_storage_ptr__,
            unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *vals)

{
  iterator __first;
  iterator __last;
  allocator<const_google::protobuf::FileDescriptor_*> local_31;
  _Node_iterator_base<const_google::protobuf::FileDescriptor_*,_false> local_30;
  _Node_iterator_base<const_google::protobuf::FileDescriptor_*,_false> local_28;
  undefined1 local_19;
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_18;
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *vals_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *sorted;
  
  local_19 = 0;
  local_18 = vals;
  vals_local = (unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)__return_storage_ptr__;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
       ::begin(vals);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
       ::end(local_18);
  std::allocator<const_google::protobuf::FileDescriptor_*>::allocator(&local_31);
  std::
  vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::
  vector<std::__detail::_Node_const_iterator<google::protobuf::FileDescriptor_const*,true,false>,void>
            ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)__return_storage_ptr__,
             (_Node_const_iterator<const_google::protobuf::FileDescriptor_*,_true,_false>)
             local_28._M_cur,
             (_Node_const_iterator<const_google::protobuf::FileDescriptor_*,_true,_false>)
             local_30._M_cur,&local_31);
  std::allocator<const_google::protobuf::FileDescriptor_*>::~allocator(&local_31);
  __first = std::
            vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::begin(__return_storage_ptr__);
  __last = std::
           vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::end(__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptor_const**,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>>,bool(*)(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*)>
            ((__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
              )__first._M_current,
             (__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
              )__last._M_current,CompareSortKeys<google::protobuf::FileDescriptor>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const T*> Sorted(const std::unordered_set<const T*>& vals) {
  std::vector<const T*> sorted(vals.begin(), vals.end());
  std::sort(sorted.begin(), sorted.end(), CompareSortKeys<T>);
  return sorted;
}